

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

void Dau_DsdGenRandPerm(int *pPerm,int nVars)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  auVar2 = _DAT_008403e0;
  if (0 < nVars) {
    lVar7 = (ulong)(uint)nVars - 1;
    auVar5._8_4_ = (int)lVar7;
    auVar5._0_8_ = lVar7;
    auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_008403e0;
    auVar6 = _DAT_008403d0;
    do {
      auVar8 = auVar6 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        pPerm[uVar4] = (int)uVar4;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        pPerm[uVar4 + 1] = (int)uVar4 + 1;
      }
      uVar4 = uVar4 + 2;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
    } while ((nVars + 1U & 0xfffffffe) != uVar4);
    if (0 < nVars) {
      uVar4 = 0;
      do {
        iVar3 = rand();
        iVar1 = pPerm[uVar4];
        pPerm[uVar4] = pPerm[iVar3 % nVars];
        pPerm[iVar3 % nVars] = iVar1;
        uVar4 = uVar4 + 1;
      } while ((uint)nVars != uVar4);
    }
  }
  return;
}

Assistant:

void Dau_DsdGenRandPerm( int * pPerm, int nVars )
{
    int v, vNew;
    for ( v = 0; v < nVars; v++ )
        pPerm[v] = v;
    for ( v = 0; v < nVars; v++ )
    {
        vNew = rand() % nVars;
        ABC_SWAP( int, pPerm[v], pPerm[vNew] );
    }
}